

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Node * prvTidyParsePre(TidyDocImpl *doc,Node *pre,GetTokenMode mode)

{
  TidyParserMemory data;
  TidyParserMemory data_00;
  Bool BVar1;
  Node *node_00;
  TidyTagId local_e4;
  Node *newnode;
  TidyParserMemory memory_2;
  TidyParserMemory memory_1;
  TidyParserMemory memory;
  Node *pNStack_30;
  parserState state;
  Node *node;
  Node *pNStack_20;
  GetTokenMode mode_local;
  Node *pre_local;
  TidyDocImpl *doc_local;
  
  pNStack_30 = (Node *)0x0;
  memory._44_4_ = 0;
  if (pre == (Node *)0x0) {
    prvTidypopMemory((TidyParserMemory *)&memory_1.register_2,doc);
    pNStack_30 = memory.original_node;
    pNStack_20 = (Node *)memory.identity;
    memory._44_4_ = memory.reentry_node._4_4_;
  }
  else {
    pNStack_20 = pre;
    if ((pre->tag->model & 1) != 0) {
      return (Node *)0x0;
    }
  }
  prvTidyInlineDup(doc,(Node *)0x0);
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          if (memory._44_4_ == 2) {
            prvTidyReport(doc,pNStack_20,pNStack_30,0x25a);
            return (Node *)0x0;
          }
          if (memory._44_4_ == 0) break;
          if (memory._44_4_ == 1) {
            node_00 = prvTidyInferredTag(doc,TidyTag_PRE);
            prvTidyReport(doc,pNStack_20,node_00,0x247);
            prvTidyInsertNodeAfterElement(pNStack_30,node_00);
            memory._44_4_ = 0;
            pNStack_20 = node_00;
          }
        }
        pNStack_30 = prvTidyGetToken(doc,Preformatted);
        if (pNStack_30 != (Node *)0x0) break;
        memory._44_4_ = 2;
      }
      if (pNStack_30->type == EndTag) break;
LAB_0014c05e:
      BVar1 = prvTidynodeIsText(pNStack_30);
      if (BVar1 == no) {
        BVar1 = InsertMisc(pNStack_20,pNStack_30);
        if (BVar1 == no) {
          if (pNStack_30->tag == (Dict *)0x0) {
            prvTidyReport(doc,pNStack_20,pNStack_30,0x235);
            prvTidyFreeNode(doc,pNStack_30);
          }
          else {
            BVar1 = PreContent(doc,pNStack_30);
            if (BVar1 == no) {
              if (pNStack_30->type != EndTag) {
                BVar1 = prvTidynodeHasCM(pNStack_30,0x280);
                if ((BVar1 == no) &&
                   (((pNStack_30 == (Node *)0x0 || (pNStack_30->tag == (Dict *)0x0)) ||
                    (pNStack_30->tag->id != TidyTag_TABLE)))) {
                  prvTidyInsertNodeAfterElement(pNStack_20,pNStack_30);
                  prvTidyReport(doc,pNStack_20,pNStack_30,0x259);
                  memset(&memory_2.register_2,0,0x30);
                  memory_2._40_8_ = prvTidyParsePre;
                  memory_1.identity = (Parser *)pNStack_20;
                  memory_1.reentry_node._4_4_ = 1;
                  data.reentry_state = 1;
                  data.reentry_mode = memory_1.reentry_node._0_4_;
                  data.original_node = pNStack_20;
                  data.identity = prvTidyParsePre;
                  data.reentry_node = pNStack_30;
                  data.mode = memory_1.reentry_mode;
                  data.register_1 = memory_1.reentry_state;
                  data.register_2 = memory_1.mode;
                  data._44_4_ = memory_1.register_1;
                  memory_1.original_node = pNStack_30;
                  prvTidypushMemory(doc,data);
                  return pNStack_30;
                }
                if (doc->lexer->exiled == no) {
                  prvTidyReport(doc,pNStack_20,pNStack_30,0x259);
                }
                prvTidyUngetToken(doc);
                return (Node *)0x0;
              }
              if ((doc->lexer->exiled != no) &&
                 ((BVar1 = prvTidynodeHasCM(pNStack_30,0x80), BVar1 != no ||
                  (((pNStack_30 != (Node *)0x0 && (pNStack_30->tag != (Dict *)0x0)) &&
                   (pNStack_30->tag->id == TidyTag_TABLE)))))) {
                prvTidyUngetToken(doc);
                TrimSpaces(doc,pNStack_20);
                return (Node *)0x0;
              }
              prvTidyReport(doc,pNStack_20,pNStack_30,0x235);
              prvTidyFreeNode(doc,pNStack_30);
            }
            else if (((pNStack_30 == (Node *)0x0) || (pNStack_30->tag == (Dict *)0x0)) ||
                    (pNStack_30->tag->id != TidyTag_P)) {
              BVar1 = prvTidynodeIsElement(pNStack_30);
              if (BVar1 != no) {
                if (((pNStack_30 != (Node *)0x0) && (pNStack_30->tag != (Dict *)0x0)) &&
                   (pNStack_30->tag->id == TidyTag_BR)) {
                  TrimSpaces(doc,pNStack_20);
                }
                prvTidyInsertNodeAtEnd(pNStack_20,pNStack_30);
                memset(&newnode,0,0x30);
                newnode = (Node *)prvTidyParsePre;
                memory_2.identity = (Parser *)pNStack_20;
                memory_2.reentry_node._4_4_ = 0;
                data_00.original_node = pNStack_20;
                data_00.identity = prvTidyParsePre;
                data_00.reentry_node = pNStack_30;
                data_00.reentry_mode = memory_2.reentry_node._0_4_;
                data_00.reentry_state = 0;
                data_00.mode = memory_2.reentry_mode;
                data_00.register_1 = memory_2.reentry_state;
                data_00.register_2 = memory_2.mode;
                data_00._44_4_ = memory_2.register_1;
                memory_2.original_node = pNStack_30;
                prvTidypushMemory(doc,data_00);
                return pNStack_30;
              }
              prvTidyReport(doc,pNStack_20,pNStack_30,0x235);
              prvTidyFreeNode(doc,pNStack_30);
            }
            else if (pNStack_30->type == StartTag) {
              prvTidyReport(doc,pNStack_20,pNStack_30,0x28e);
              TrimSpaces(doc,pNStack_20);
              prvTidyCoerceNode(doc,pNStack_30,TidyTag_BR,no,no);
              prvTidyFreeAttrs(doc,pNStack_30);
              prvTidyInsertNodeAtEnd(pNStack_20,pNStack_30);
            }
            else {
              prvTidyReport(doc,pNStack_20,pNStack_30,0x235);
              prvTidyFreeNode(doc,pNStack_30);
            }
          }
        }
      }
      else {
        prvTidyInsertNodeAtEnd(pNStack_20,pNStack_30);
      }
    }
    if (pNStack_30->tag != pNStack_20->tag) {
      if ((pNStack_30 == (Node *)0x0) || (pNStack_30->tag == (Dict *)0x0)) {
        local_e4 = TidyTag_UNKNOWN;
      }
      else {
        local_e4 = pNStack_30->tag->id;
      }
      BVar1 = DescendantOf(pNStack_20,local_e4);
      if (BVar1 == no) goto LAB_0014c05e;
    }
    if ((((pNStack_30 == (Node *)0x0) || (pNStack_30->tag == (Dict *)0x0)) ||
        (pNStack_30->tag->id != TidyTag_BODY)) &&
       (((pNStack_30 == (Node *)0x0 || (pNStack_30->tag == (Dict *)0x0)) ||
        (pNStack_30->tag->id != TidyTag_HTML)))) {
      if (pNStack_30->tag == pNStack_20->tag) {
        prvTidyFreeNode(doc,pNStack_30);
      }
      else {
        prvTidyReport(doc,pNStack_20,pNStack_30,0x259);
        prvTidyUngetToken(doc);
      }
      pNStack_20->closed = yes;
      TrimSpaces(doc,pNStack_20);
      return (Node *)0x0;
    }
    prvTidyReport(doc,pNStack_20,pNStack_30,0x235);
    prvTidyFreeNode(doc,pNStack_30);
  } while( true );
}

Assistant:

Node* TY_(ParsePre)( TidyDocImpl* doc, Node *pre, GetTokenMode ARG_UNUSED(mode) )
{
    Node *node = NULL;
    DEBUG_LOG_COUNTERS;

    enum parserState {
        STATE_INITIAL,                /* This is the initial state for every parser. */
        STATE_RENTRY_ACTION,          /* To-do after re-entering after checks. */
        STATE_COMPLETE,               /* Done with the switch. */
    } state = STATE_INITIAL;


    if ( pre == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, as main loop overrwrites anyway. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        pre = memory.original_node;
        state = memory.reentry_state;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(pre);
        if (pre->tag->model & CM_EMPTY)
        {
            DEBUG_LOG_EXIT;
            return NULL;
        }
    }

    TY_(InlineDup)( doc, NULL ); /* tell lexer to insert inlines if needed */

    while ( state != STATE_COMPLETE )
    {
        if ( state == STATE_INITIAL )
            node = TY_(GetToken)(doc, Preformatted);
        
        switch ( state )
        {
            case STATE_INITIAL:
            {
                if ( node == NULL )
                {
                    state = STATE_COMPLETE;
                    continue;
                }
                
                if ( node->type == EndTag &&
                     (node->tag == pre->tag || DescendantOf(pre, TagId(node))) )
                {
                    if (nodeIsBODY(node) || nodeIsHTML(node))
                    {
                        TY_(Report)(doc, pre, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)(doc, node);
                        continue;
                    }
                    if (node->tag == pre->tag)
                    {
                        TY_(FreeNode)(doc, node);
                    }
                    else
                    {
                        TY_(Report)(doc, pre, node, MISSING_ENDTAG_BEFORE );
                        TY_(UngetToken)( doc );
                    }
                    pre->closed = yes;
                    TrimSpaces(doc, pre);
                    DEBUG_LOG_EXIT;
                    return NULL;
                }

                if (TY_(nodeIsText)(node))
                {
                    TY_(InsertNodeAtEnd)(pre, node);
                    continue;
                }

                /* deal with comments etc. */
                if (InsertMisc(pre, node))
                    continue;

                if (node->tag == NULL)
                {
                    TY_(Report)(doc, pre, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)(doc, node);
                    continue;
                }

                /* strip unexpected tags */
                if ( !PreContent(doc, node) )
                {
                    /* fix for http://tidy.sf.net/bug/772205 */
                    if (node->type == EndTag)
                    {
                        /* http://tidy.sf.net/issue/1590220 */
                       if ( doc->lexer->exiled
                           && (TY_(nodeHasCM)(node, CM_TABLE) || nodeIsTABLE(node)) )
                       {
                          TY_(UngetToken)(doc);
                          TrimSpaces(doc, pre);
                           DEBUG_LOG_EXIT;
                          return NULL;
                       }

                       TY_(Report)(doc, pre, node, DISCARDING_UNEXPECTED);
                       TY_(FreeNode)(doc, node);
                       continue;
                    }
                    /* http://tidy.sf.net/issue/1590220 */
                    else if (TY_(nodeHasCM)(node, CM_TABLE|CM_ROW)
                             || nodeIsTABLE(node) )
                    {
                        if (!doc->lexer->exiled)
                            /* No missing close warning if exiled. */
                            TY_(Report)(doc, pre, node, MISSING_ENDTAG_BEFORE);

                        TY_(UngetToken)(doc);
                        DEBUG_LOG_EXIT;
                        return NULL;
                    }

                    /*
                      This is basically what Tidy 04 August 2000 did and far more accurate
                      with respect to browser behaivour than the code commented out above.
                      Tidy could try to propagate the <pre> into each disallowed child where
                      <pre> is allowed in order to replicate some browsers behaivour, but
                      there are a lot of exceptions, e.g. Internet Explorer does not propagate
                      <pre> into table cells while Mozilla does. Opera 6 never propagates
                      <pre> into blocklevel elements while Opera 7 behaves much like Mozilla.

                      Tidy behaves thus mostly like Opera 6 except for nested <pre> elements
                      which are handled like Mozilla takes them (Opera6 closes all <pre> after
                      the first </pre>).

                      There are similar issues like replacing <p> in <pre> with <br>, for
                      example

                        <pre>...<p>...</pre>                 (Input)
                        <pre>...<br>...</pre>                (Tidy)
                        <pre>...<br>...</pre>                (Opera 7 and Internet Explorer)
                        <pre>...<br><br>...</pre>            (Opera 6 and Mozilla)

                        <pre>...<p>...</p>...</pre>          (Input)
                        <pre>...<br>......</pre>             (Tidy, BUG!)
                        <pre>...<br>...<br>...</pre>         (Internet Explorer)
                        <pre>...<br><br>...<br><br>...</pre> (Mozilla, Opera 6)
                        <pre>...<br>...<br><br>...</pre>     (Opera 7)

                      or something similar, they could also be closing the <pre> and propagate
                      the <pre> into the newly opened <p>.

                      Todo: IMG, OBJECT, APPLET, BIG, SMALL, SUB, SUP, FONT, and BASEFONT are
                      disallowed in <pre>, Tidy neither detects this nor does it perform any
                      cleanup operation. Tidy should at least issue a warning if it encounters
                      such constructs.

                      Todo: discarding </p> is abviously a bug, it should be replaced by <br>.
                    */
                    TY_(InsertNodeAfterElement)(pre, node);
                    TY_(Report)(doc, pre, node, MISSING_ENDTAG_BEFORE);
                    
                    {
                        TidyParserMemory memory = {0};
                        memory.identity = TY_(ParsePre);
                        memory.original_node = pre;
                        memory.reentry_node = node;
                        memory.reentry_state = STATE_RENTRY_ACTION;
                        TY_(pushMemory)( doc, memory );
                        DEBUG_LOG_EXIT_WITH_NODE(node);
                        return node;
                    }
                }

                if ( nodeIsP(node) )
                {
                    if (node->type == StartTag)
                    {
                        TY_(Report)(doc, pre, node, USING_BR_INPLACE_OF);

                        /* trim white space before <p> in <pre>*/
                        TrimSpaces(doc, pre);

                        /* coerce both <p> and </p> to <br> */
                        TY_(CoerceNode)(doc, node, TidyTag_BR, no, no);
                        TY_(FreeAttrs)( doc, node ); /* discard align attribute etc. */
                        TY_(InsertNodeAtEnd)( pre, node );
                    }
                    else
                    {
                        TY_(Report)(doc, pre, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node);
                    }
                    continue;
                }

                if ( TY_(nodeIsElement)(node) )
                {
                    /* trim white space before <br> */
                    if ( nodeIsBR(node) )
                        TrimSpaces(doc, pre);

                    TY_(InsertNodeAtEnd)(pre, node);
                    
                    {
                        TidyParserMemory memory = {0};
                        memory.identity = TY_(ParsePre);
                        memory.original_node = pre;
                        memory.reentry_node = node;
                        memory.reentry_state = STATE_INITIAL;
                        TY_(pushMemory)( doc, memory );
                        DEBUG_LOG_EXIT_WITH_NODE(node);
                        return node;
                    }
                }

                /* discard unexpected tags */
                TY_(Report)(doc, pre, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
            } break;
                
            case STATE_RENTRY_ACTION:
            {
                Node* newnode = TY_(InferredTag)(doc, TidyTag_PRE);
                TY_(Report)(doc, pre, newnode, INSERTING_TAG);
                pre = newnode;
                TY_(InsertNodeAfterElement)(node, pre);
                state = STATE_INITIAL;
                continue;
            } break;
            
            default:
                break;

        } /* switch */
    } /* while */

    TY_(Report)(doc, pre, node, MISSING_ENDTAG_FOR);
    DEBUG_LOG_EXIT;
    return NULL;
}